

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O3

bool __thiscall tcu::RGBA::isBelowThreshold(RGBA *this,RGBA thr)

{
  uint uVar1;
  
  uVar1 = this->m_value;
  if ((((uVar1 & 0xff) <= (thr.m_value & 0xff)) &&
      ((uVar1 >> 8 & 0xff) <= (thr.m_value >> 8 & 0xff))) &&
     ((uVar1 >> 0x10 & 0xff) <= (thr.m_value >> 0x10 & 0xff))) {
    return uVar1 >> 0x18 <= thr.m_value >> 0x18;
  }
  return false;
}

Assistant:

int			getBlue					(void) const { return (int)((m_value >> (deUint32)BLUE_SHIFT)  & 0xFFu); }